

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.cpp
# Opt level: O2

ObjectHeader * __thiscall
Lodtalk::VMContext::newObject
          (VMContext *this,size_t fixedSlotCount,size_t indexableSize,ObjectFormat format,
          int classIndex,int identityHash)

{
  bool bVar1;
  uint uVar2;
  size_t i;
  size_t sVar3;
  ulong uVar4;
  ObjectHeader *pOVar5;
  ObjectHeader OVar6;
  ObjectHeader OVar7;
  uint uVar8;
  
  sVar3 = variableSlotSizeFor(format);
  bVar1 = false;
  uVar4 = 0;
  uVar8 = 0;
  if ((indexableSize != 0) && (uVar8 = 0, sVar3 != 0)) {
    bVar1 = false;
    if ((int)format < 9) {
      uVar8 = 0;
      uVar4 = indexableSize;
    }
    else {
      sVar3 = variableSlotDivisor(format);
      uVar4 = (-sVar3 & (indexableSize + sVar3) - 1) / sVar3;
      if (uVar4 * sVar3 < indexableSize) {
        __assert_fail("indexableSize <= indexableSlotCount*divisor",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/ObjectModel.cpp"
                      ,0x2e,
                      "ObjectHeader *Lodtalk::VMContext::newObject(size_t, size_t, ObjectFormat, int, int)"
                     );
      }
      uVar8 = (uint)indexableSize & (int)sVar3 - 1U;
      bVar1 = true;
    }
  }
  OVar7 = (ObjectHeader)(uVar4 + fixedSlotCount);
  OVar6 = (ObjectHeader)0xff;
  if (0xfe >= (ulong)OVar7) {
    OVar6 = OVar7;
  }
  pOVar5 = (ObjectHeader *)allocateObjectMemory(this,(long)OVar7 * 8 + 8,0xfe < (ulong)OVar7);
  uVar2 = (uint)((ulong)pOVar5 >> 3) & 0x1fffffff;
  if (-1 < identityHash) {
    uVar2 = identityHash;
  }
  *pOVar5 = (ObjectHeader)
            ((ulong)(uint)classIndex << 0x2a | (ulong)(uVar8 + format & 0x1f) << 0x23 | (ulong)OVar6
            | (ulong)(uVar2 << 10));
  if (0xfe < (ulong)OVar7) {
    pOVar5[-1] = OVar7;
  }
  if (bVar1) {
    memset(pOVar5 + 1,0,(long)OVar7 * 8);
  }
  else {
    for (OVar6 = (ObjectHeader)0x0; OVar7 != OVar6; OVar6 = (ObjectHeader)((long)OVar6 + 1)) {
      (pOVar5 + 1)[(long)OVar6] = (ObjectHeader)&NilObject;
    }
  }
  return pOVar5;
}

Assistant:

ObjectHeader *VMContext::newObject(size_t fixedSlotCount, size_t indexableSize, ObjectFormat format, int classIndex, int identityHash)
{
	// Compute the header size.
	size_t indexableSlotCount = 0;
	auto indexableSlotSize = variableSlotSizeFor(format);
	auto indexableFormatExtraBits = 0;
	bool hasPrimitiveData = false;
	if(indexableSlotSize && indexableSize)
	{
		if(format < OF_INDEXABLE_NATIVE_FIRST)
		{
			indexableSlotCount = indexableSize;
		}
#ifndef OBJECT_MODEL_SPUR_64
		else if(format == OF_INDEXABLE_64)
		{
			indexableSlotCount = indexableSize * 2;
			hasPrimitiveData = true;
		}
#endif
		else
		{
			hasPrimitiveData = true;
			size_t divisor = variableSlotDivisor(format);
			size_t mask = (divisor - 1);

		 	indexableSlotCount = ((indexableSize + divisor - 1) & (~mask)) / divisor;
			indexableFormatExtraBits = int(indexableSize & mask);
			assert(indexableSize <= indexableSlotCount*divisor);
		}
	}